

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O1

bool __thiscall cppjieba::SegmentBase::ResetSeparators(SegmentBase *this,string *s)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  __hashtable *__h;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  RuneStrArray runes;
  char *local_328;
  long local_320;
  char local_318 [8];
  undefined8 uStack_310;
  RuneStrArray local_308;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_1b0 [48];
  
  this_00 = &this->symbols_;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&this_00->_M_h);
  lVar2 = 8;
  do {
    *(undefined8 *)((long)&uStack_310 + lVar2) = 0;
    *(undefined4 *)((long)&local_308.buffer_[0].rune + lVar2) = 0;
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0x148);
  local_308.ptr_ = local_308.buffer_;
  local_308.size_ = 0;
  local_308.capacity_ = 0x10;
  bVar1 = DecodeRunesInString((s->_M_dataplus)._M_p,s->_M_string_length,
                              (RuneStrArray *)local_308.ptr_);
  if (bVar1) {
    bVar1 = local_308.size_ == 0;
    if (!bVar1) {
      lVar2 = 0;
      uVar4 = 0;
      do {
        local_1b0[0] = this_00;
        pVar5 = std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)this_00,(long)&((RuneStr *)&(local_308.ptr_)->rune)->rune + lVar2,
                           local_1b0);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          limonp::Logger::Logger
                    ((Logger *)local_1b0,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/SegmentBase.hpp"
                     ,0x22);
          std::__cxx11::string::substr((ulong)&local_328,(ulong)s);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1b0,local_328,local_320);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," already exists",0xf);
          if (local_328 != local_318) {
            operator_delete(local_328);
          }
          limonp::Logger::~Logger((Logger *)local_1b0);
          break;
        }
        uVar4 = uVar4 + 1;
        lVar2 = lVar2 + 0x14;
        bVar1 = uVar4 >= local_308.size_;
      } while (uVar4 < local_308.size_);
    }
  }
  else {
    limonp::Logger::Logger
              ((Logger *)local_1b0,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/SegmentBase.hpp"
               ,0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"decode ",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1b0,(s->_M_dataplus)._M_p,s->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," failed",7);
    limonp::Logger::~Logger((Logger *)local_1b0);
    bVar1 = false;
  }
  if ((RuneStrArray *)local_308.ptr_ != &local_308) {
    free(local_308.ptr_);
  }
  return bVar1;
}

Assistant:

bool ResetSeparators(const string& s) {
    symbols_.clear();
    RuneStrArray runes;
    if (!DecodeRunesInString(s, runes)) {
      XLOG(ERROR) << "decode " << s << " failed";
      return false;
    }
    for (size_t i = 0; i < runes.size(); i++) {
      if (!symbols_.insert(runes[i].rune).second) {
        XLOG(ERROR) << s.substr(runes[i].offset, runes[i].len) << " already exists";
        return false;
      }
    }
    return true;
  }